

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O2

void wavwrite(double *x,int x_length,int fs,int nbit,char *filename)

{
  FILE *__s;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  uint32_t long_number;
  int16_t tmp_signal;
  uint32_t local_44;
  undefined4 local_40;
  int16_t short_number;
  double *local_38;
  
  local_38 = x;
  __s = fopen(filename,"wb");
  if (__s != (FILE *)0x0) {
    local_40 = 0x46464952;
    local_44 = x_length * 2;
    long_number = x_length * 2 + 0x24;
    fwrite(&local_40,1,4,__s);
    fwrite(&long_number,4,1,__s);
    local_40 = 0x45564157;
    fwrite(&local_40,1,4,__s);
    local_40 = 0x20746d66;
    fwrite(&local_40,1,4,__s);
    long_number = 0x10;
    fwrite(&long_number,4,1,__s);
    short_number = 1;
    fwrite(&short_number,2,1,__s);
    short_number = 1;
    fwrite(&short_number,2,1,__s);
    long_number = fs;
    fwrite(&long_number,4,1,__s);
    long_number = fs * 2;
    fwrite(&long_number,4,1,__s);
    short_number = 2;
    fwrite(&short_number,2,1,__s);
    short_number = 0x10;
    fwrite(&short_number,2,1,__s);
    local_40 = 0x61746164;
    fwrite(&local_40,1,4,__s);
    long_number = local_44;
    fwrite(&long_number,4,1,__s);
    uVar2 = 0;
    uVar1 = (ulong)(uint)x_length;
    if (x_length < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      dVar4 = -32768.0;
      if (-32768.0 <= local_38[uVar2] * 32767.0) {
        dVar4 = local_38[uVar2] * 32767.0;
      }
      dVar3 = 32767.0;
      if (dVar4 <= 32767.0) {
        dVar3 = dVar4;
      }
      tmp_signal = (int16_t)(int)dVar3;
      fwrite(&tmp_signal,2,1,__s);
    }
    fclose(__s);
    return;
  }
  puts("File cannot be opened.");
  return;
}

Assistant:

void wavwrite(const double *x, int x_length, int fs, int nbit,
    const char *filename) {
  FILE *fp = fopen(filename, "wb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return;
  }

  char text[4] = {'R', 'I', 'F', 'F'};
  uint32_t long_number = 36 + x_length * 2;
  fwrite(text, 1, 4, fp);
  fwrite(&long_number, 4, 1, fp);

  text[0] = 'W';
  text[1] = 'A';
  text[2] = 'V';
  text[3] = 'E';
  fwrite(text, 1, 4, fp);
  text[0] = 'f';
  text[1] = 'm';
  text[2] = 't';
  text[3] = ' ';
  fwrite(text, 1, 4, fp);

  long_number = 16;
  fwrite(&long_number, 4, 1, fp);
  int16_t short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  short_number = 1;
  fwrite(&short_number, 2, 1, fp);
  long_number = fs;
  fwrite(&long_number, 4, 1, fp);
  long_number = fs * 2;
  fwrite(&long_number, 4, 1, fp);
  short_number = 2;
  fwrite(&short_number, 2, 1, fp);
  short_number = 16;
  fwrite(&short_number, 2, 1, fp);

  text[0] = 'd';
  text[1] = 'a';
  text[2] = 't';
  text[3] = 'a';
  fwrite(text, 1, 4, fp);
  long_number = x_length * 2;
  fwrite(&long_number, 4, 1, fp);

  int16_t tmp_signal;
  for (int i = 0; i < x_length; ++i) {
    tmp_signal = static_cast<int16_t>(MyMaxInt(-32768,
        MyMinInt(32767, static_cast<int>(x[i] * 32767))));
    fwrite(&tmp_signal, 2, 1, fp);
  }

  fclose(fp);
}